

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O1

void __thiscall kws::Generator::ReadConfigurationFile(Generator *this,char *configFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  XMLReader reader;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  XMLReader local_290;
  
  XMLReader::XMLReader(&local_290);
  bVar2 = XMLReader::Open(&local_290,configFile);
  if (bVar2) {
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Project","");
    XMLReader::GetValue(&local_330,&local_290,&local_2b0);
    std::__cxx11::string::operator=((string *)&this->m_ProjectTitle,(string *)&local_330);
    paVar1 = &local_330.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"ProjectLogo","");
    XMLReader::GetValue(&local_330,&local_290,&local_2d0);
    std::__cxx11::string::operator=((string *)&this->m_ProjectLogo,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"KWStyleLogo","");
    XMLReader::GetValue(&local_330,&local_290,&local_2f0);
    std::__cxx11::string::operator=((string *)&this->m_KWStyleLogo,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"ErrorThreshold","");
    XMLReader::GetValue(&local_330,&local_290,&local_310);
    uVar3 = atoi(local_330._M_dataplus._M_p);
    this->m_ErrorThreshold = uVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar1) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    XMLReader::Close(&local_290);
  }
  XMLReader::~XMLReader(&local_290);
  return;
}

Assistant:

void Generator::ReadConfigurationFile(const char* configFile)
{
  kws::XMLReader reader;
  if(reader.Open(configFile))
    {
    m_ProjectTitle = reader.GetValue("Project");
    m_ProjectLogo = reader.GetValue("ProjectLogo");
    m_KWStyleLogo = reader.GetValue("KWStyleLogo");
    m_ErrorThreshold = atoi(reader.GetValue("ErrorThreshold").c_str());
    reader.Close();
    }
}